

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_index.h
# Opt level: O0

void __thiscall MeCab::FeatureIndex::~FeatureIndex(FeatureIndex *this)

{
  DictionaryRewriter *in_RDI;
  ChunkFreeList<char> *unaff_retaddr;
  
  (in_RDI->unigram_rewrite_).
  super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
  super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR___cxa_pure_virtual_001889b8;
  StringBuffer::~StringBuffer((StringBuffer *)in_RDI);
  DictionaryRewriter::~DictionaryRewriter(in_RDI);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)unaff_retaddr);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)unaff_retaddr);
  ChunkFreeList<char>::~ChunkFreeList(unaff_retaddr);
  ChunkFreeList<int>::~ChunkFreeList((ChunkFreeList<int> *)unaff_retaddr);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr);
  return;
}

Assistant:

virtual ~FeatureIndex() {}